

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenLiteral * BinaryenLiteralFloat64Bits(BinaryenLiteral *__return_storage_ptr__,int64_t x)

{
  Literal x_00;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc8;
  Literal local_28;
  
  wasm::Literal::castToF64(&local_28,(Literal *)&stack0xffffffffffffffc0);
  x_00.field_0._8_8_ = x;
  x_00.field_0.i64 = in_stack_ffffffffffffffb8;
  x_00.type.id = in_stack_ffffffffffffffc8;
  toBinaryenLiteral(__return_storage_ptr__,x_00);
  wasm::Literal::~Literal(&local_28);
  wasm::Literal::~Literal((Literal *)&stack0xffffffffffffffc0);
  return __return_storage_ptr__;
}

Assistant:

BinaryenLiteral BinaryenLiteralFloat64Bits(int64_t x) {
  return toBinaryenLiteral(Literal(x).castToF64());
}